

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

optional<int>
wallet::ReadPragmaInteger(sqlite3 *db,string *key,string *description,bilingual_str *error)

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  char **args_1;
  ulong uVar4;
  long in_FS_OFFSET;
  sqlite3_stmt *pragma_read_stmt;
  string stmt_text;
  undefined1 local_e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tinyformat::format<std::__cxx11::string>
            (&local_58,(tinyformat *)"PRAGMA %s",(char *)key,&error->original);
  local_e8._8_8_ = 0;
  args_1 = (char **)0x0;
  iVar1 = sqlite3_prepare_v2(db,local_58._M_dataplus._M_p,0xffffffff);
  if (iVar1 == 0) {
    iVar1 = sqlite3_step();
    if (iVar1 == 100) {
      uVar2 = sqlite3_column_int(local_e8._8_8_,0);
      psVar3 = (string *)(ulong)uVar2;
      sqlite3_finalize(local_e8._8_8_);
      uVar4 = 0x100000000;
      goto LAB_00c4b47e;
    }
    sqlite3_finalize(local_e8._8_8_);
    local_e8._0_8_ = sqlite3_errstr(iVar1);
    tinyformat::format<std::__cxx11::string,char_const*>
              ((string *)(local_e8 + 0x10),(tinyformat *)"SQLiteDatabase: Failed to fetch %s: %s",
               (char *)description,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,args_1)
    ;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_e8._16_8_,local_e8._24_8_ + local_e8._16_8_);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_e8._16_8_,local_e8._24_8_ + local_e8._16_8_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_b8.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
    local_b8._M_dataplus._M_p = (pointer)local_e8._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._16_8_ != &local_c8) goto LAB_00c4b677;
  }
  else {
    sqlite3_finalize(local_e8._8_8_);
    local_e8._0_8_ = sqlite3_errstr(iVar1);
    tinyformat::format<std::__cxx11::string,char_const*>
              (&local_b8,
               (tinyformat *)"SQLiteDatabase: Failed to prepare the statement to fetch %s: %s",
               (char *)description,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,args_1)
    ;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,&local_98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00c4b677:
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  psVar3 = &error->translated;
  uVar4 = 0;
LAB_00c4b47e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)(uVar4 | (ulong)psVar3 & 0xffffffff);
}

Assistant:

static std::optional<int> ReadPragmaInteger(sqlite3* db, const std::string& key, const std::string& description, bilingual_str& error)
{
    std::string stmt_text = strprintf("PRAGMA %s", key);
    sqlite3_stmt* pragma_read_stmt{nullptr};
    int ret = sqlite3_prepare_v2(db, stmt_text.c_str(), -1, &pragma_read_stmt, nullptr);
    if (ret != SQLITE_OK) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to prepare the statement to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    ret = sqlite3_step(pragma_read_stmt);
    if (ret != SQLITE_ROW) {
        sqlite3_finalize(pragma_read_stmt);
        error = Untranslated(strprintf("SQLiteDatabase: Failed to fetch %s: %s", description, sqlite3_errstr(ret)));
        return std::nullopt;
    }
    int result = sqlite3_column_int(pragma_read_stmt, 0);
    sqlite3_finalize(pragma_read_stmt);
    return result;
}